

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O0

void sat_solver2_rollback(sat_solver2 *s)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  cla *pArray;
  int local_20;
  int j;
  int k;
  int i;
  Sat_Mem_t *pMem;
  sat_solver2 *s_local;
  
  sat_solver2_rollback::Count = sat_solver2_rollback::Count + 1;
  if ((s->iVarPivot < 0) || (s->size < s->iVarPivot)) {
    __assert_fail("s->iVarPivot >= 0 && s->iVarPivot <= s->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x638,"void sat_solver2_rollback(sat_solver2 *)");
  }
  if ((s->iTrailPivot < 0) || (s->qtail < s->iTrailPivot)) {
    __assert_fail("s->iTrailPivot >= 0 && s->iTrailPivot <= s->qtail",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x639,"void sat_solver2_rollback(sat_solver2 *)");
  }
  if ((s->pPrf1 != (Vec_Set_t *)0x0) &&
     ((s->hProofPivot < 1 ||
      (iVar2 = s->hProofPivot, iVar1 = Vec_SetHandCurrent(s->pPrf1), iVar1 < iVar2)))) {
    __assert_fail("s->pPrf1 == NULL || (s->hProofPivot >= 1 && s->hProofPivot <= Vec_SetHandCurrent(s->pPrf1))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x63a,"void sat_solver2_rollback(sat_solver2 *)");
  }
  solver2_canceluntil_rollback(s,s->iTrailPivot);
  if (s->iVarPivot < s->size) {
    if (s->activity2 != (uint *)0x0) {
      s->var_inc = s->var_inc2;
      memcpy(s->activity,s->activity2,(long)s->iVarPivot << 2);
    }
    veci_resize(&s->order,0);
    for (j = 0; j < s->iVarPivot; j = j + 1) {
      iVar2 = var_value(s,j);
      if (iVar2 == 3) {
        iVar2 = veci_size(&s->order);
        s->orderpos[j] = iVar2;
        veci_push(&s->order,j);
        order_update(s,j);
      }
    }
  }
  for (j = 0; SBORROW4(j,s->iVarPivot * 2) != j + s->iVarPivot * -2 < 0; j = j + 1) {
    piVar3 = veci_begin(s->wlists + j);
    pArray._4_4_ = 0;
    for (local_20 = 0; iVar2 = veci_size(s->wlists + j), local_20 < iVar2; local_20 = local_20 + 1)
    {
      iVar2 = Sat_MemClauseUsed(&s->Mem,piVar3[local_20]);
      if (iVar2 != 0) {
        piVar3[pArray._4_4_] = piVar3[local_20];
        pArray._4_4_ = pArray._4_4_ + 1;
      }
    }
    veci_resize(s->wlists + j,pArray._4_4_);
  }
  for (j = s->iVarPivot << 1; SBORROW4(j,s->size * 2) != j + s->size * -2 < 0; j = j + 1) {
    s->wlists[j].size = 0;
  }
  (s->stats).clauses = (s->Mem).BookMarkE[0];
  (s->stats).learnts = (s->Mem).BookMarkE[1];
  Sat_MemRollBack(&s->Mem);
  veci_resize(&s->act_clas,(s->stats).learnts);
  if (s->pPrf1 != (Vec_Set_t *)0x0) {
    veci_resize(&s->claProofs,(s->stats).learnts);
    Vec_SetShrink(s->pPrf1,s->hProofPivot);
  }
  if (s->pPrf2 != (Prf_Man_t *)0x0) {
    __assert_fail("s->pPrf2 == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x66c,"void sat_solver2_rollback(sat_solver2 *)");
  }
  s->size = s->iVarPivot;
  if (s->size == 0) {
    s->qhead = 0;
    s->qtail = 0;
    s->var_inc = 0x20;
    s->cla_inc = 0x800;
    s->root_level = 0;
    s->random_seed = 91648253.0;
    s->progress_estimate = 0.0;
    s->verbosity = 0;
    (s->stats).starts = 0;
    (s->stats).decisions = 0;
    (s->stats).propagations = 0;
    (s->stats).inspects = 0;
    (s->stats).conflicts = 0;
    (s->stats).clauses = 0;
    (s->stats).clauses_literals = 0;
    (s->stats).learnts = 0;
    (s->stats).learnts_literals = 0;
    (s->stats).tot_literals = 0;
    s->hLearntLast = -1;
    s->hProofLast = -1;
    s->iVarPivot = 0;
    s->iTrailPivot = 0;
    s->hProofPivot = 1;
  }
  return;
}

Assistant:

void sat_solver2_rollback( sat_solver2* s )
{
    Sat_Mem_t * pMem = &s->Mem;
    int i, k, j;
    static int Count = 0;
    Count++;
    assert( s->iVarPivot >= 0 && s->iVarPivot <= s->size );
    assert( s->iTrailPivot >= 0 && s->iTrailPivot <= s->qtail );
    assert( s->pPrf1 == NULL || (s->hProofPivot >= 1 && s->hProofPivot <= Vec_SetHandCurrent(s->pPrf1)) );
    // reset implication queue
    solver2_canceluntil_rollback( s, s->iTrailPivot );
    // update order 
    if ( s->iVarPivot < s->size )
    { 
        if ( s->activity2 )
        {
            s->var_inc = s->var_inc2;
            memcpy( s->activity, s->activity2, sizeof(unsigned) * s->iVarPivot );
        }
        veci_resize(&s->order, 0);
        for ( i = 0; i < s->iVarPivot; i++ )
        {
            if ( var_value(s, i) != varX )
                continue;
            s->orderpos[i] = veci_size(&s->order);
            veci_push(&s->order,i);
            order_update(s, i);
        }
    }
    // compact watches
    for ( i = 0; i < s->iVarPivot*2; i++ )
    {
        cla* pArray = veci_begin(&s->wlists[i]);
        for ( j = k = 0; k < veci_size(&s->wlists[i]); k++ )
            if ( Sat_MemClauseUsed(pMem, pArray[k]) )
                pArray[j++] = pArray[k];
        veci_resize(&s->wlists[i],j);
    }
    // reset watcher lists
    for ( i = 2*s->iVarPivot; i < 2*s->size; i++ )
        s->wlists[i].size = 0;

    // reset clause counts
    s->stats.clauses = pMem->BookMarkE[0];
    s->stats.learnts = pMem->BookMarkE[1];
    // rollback clauses
    Sat_MemRollBack( pMem );

    // resize learned arrays
    veci_resize(&s->act_clas,  s->stats.learnts);
    if ( s->pPrf1 ) 
    {
        veci_resize(&s->claProofs, s->stats.learnts);
        Vec_SetShrink(s->pPrf1, s->hProofPivot); 
        // some weird bug here, which shows only on 64-bits!
        // temporarily, perform more general proof reduction
//        Sat_ProofReduce( s->pPrf1, &s->claProofs, s->hProofPivot );
    }
    assert( s->pPrf2 == NULL );
//    if ( s->pPrf2 )
//        Prf_ManShrink( s->pPrf2, s->stats.learnts );

    // initialize other vars
    s->size = s->iVarPivot;
    if ( s->size == 0 )
    {
    //    s->size                   = 0;
    //    s->cap                    = 0;
        s->qhead                  = 0;
        s->qtail                  = 0;
#ifdef USE_FLOAT_ACTIVITY2
        s->var_inc                = 1;
        s->cla_inc                = 1;
        s->var_decay              = (float)(1 / 0.95  );
        s->cla_decay              = (float)(1 / 0.999 );
#else
        s->var_inc                = (1 <<  5);
        s->cla_inc                = (1 << 11);
#endif
        s->root_level             = 0;
        s->random_seed            = 91648253;
        s->progress_estimate      = 0;
        s->verbosity              = 0;

        s->stats.starts           = 0;
        s->stats.decisions        = 0;
        s->stats.propagations     = 0;
        s->stats.inspects         = 0;
        s->stats.conflicts        = 0;
        s->stats.clauses          = 0;
        s->stats.clauses_literals = 0;
        s->stats.learnts          = 0;
        s->stats.learnts_literals = 0;
        s->stats.tot_literals     = 0;
        // initialize clause pointers
        s->hLearntLast            = -1; // the last learnt clause 
        s->hProofLast             = -1; // the last proof ID

        // initialize rollback
        s->iVarPivot              =  0; // the pivot for variables
        s->iTrailPivot            =  0; // the pivot for trail
        s->hProofPivot            =  1; // the pivot for proof records
    }
}